

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yang_print_parsed_body(lys_ypr_ctx *pctx,lysp_module *modp)

{
  ly_bool lVar1;
  lysp_ext_instance *local_98;
  lysp_node *local_88;
  lysp_node *local_78;
  lysp_node *local_68;
  lysp_node *local_58;
  lysp_node_augment *local_48;
  lysp_node_augment *aug;
  lysp_node_grp *grp;
  lysp_node_notif *notif;
  lysp_node_action *action;
  lysp_node *data;
  uint64_t u;
  lysp_module *modp_local;
  lys_ypr_ctx *pctx_local;
  
  data = (lysp_node *)0x0;
  while( true ) {
    if (modp->extensions == (lysp_ext *)0x0) {
      local_58 = (lysp_node *)0x0;
    }
    else {
      local_58 = (lysp_node *)modp->extensions[-1].compiled;
    }
    if (local_58 <= data) break;
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_extension(pctx,modp->extensions + (long)data);
    data = (lysp_node *)((long)&data->parent + 1);
  }
  if (modp->extensions != (lysp_ext *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  lVar1 = yprp_extension_has_printable_instances(modp->exts);
  if (lVar1 != '\0') {
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_extension_instances(pctx,LY_STMT_MODULE,'\0',modp->exts,(ly_bool *)0x0);
  }
  if (modp->exts != (lysp_ext_instance *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  data = (lysp_node *)0x0;
  while( true ) {
    if (modp->features == (lysp_feature *)0x0) {
      local_68 = (lysp_node *)0x0;
    }
    else {
      local_68 = *(lysp_node **)&modp->features[-1].flags;
    }
    if (local_68 <= data) break;
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_feature(pctx,modp->features + (long)data);
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
    data = (lysp_node *)((long)&data->parent + 1);
  }
  if (modp->features != (lysp_feature *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  data = (lysp_node *)0x0;
  while( true ) {
    if (modp->identities == (lysp_ident *)0x0) {
      local_78 = (lysp_node *)0x0;
    }
    else {
      local_78 = *(lysp_node **)&modp->identities[-1].flags;
    }
    if (local_78 <= data) break;
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_identity(pctx,modp->identities + (long)data);
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
    data = (lysp_node *)((long)&data->parent + 1);
  }
  if (modp->identities != (lysp_ident *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  data = (lysp_node *)0x0;
  while( true ) {
    if (modp->typedefs == (lysp_tpdf *)0x0) {
      local_88 = (lysp_node *)0x0;
    }
    else {
      local_88 = *(lysp_node **)&modp->typedefs[-1].flags;
    }
    if (local_88 <= data) break;
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_typedef(pctx,modp->typedefs + (long)data);
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
    data = (lysp_node *)((long)&data->parent + 1);
  }
  if (modp->typedefs != (lysp_tpdf *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  for (aug = (lysp_node_augment *)modp->groupings; aug != (lysp_node_augment *)0x0;
      aug = (aug->field_0).field_1.next) {
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_grouping(pctx,(lysp_node_grp *)aug);
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  if (modp->groupings != (lysp_node_grp *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  for (action = (lysp_node_action *)modp->data; action != (lysp_node_action *)0x0;
      action = (action->field_0).field_1.next) {
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_node(pctx,(lysp_node *)action);
  }
  if (modp->data != (lysp_node *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  for (local_48 = modp->augments; local_48 != (lysp_node_augment *)0x0;
      local_48 = (local_48->field_0).field_1.next) {
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_augment(pctx,local_48);
  }
  if (modp->augments != (lysp_node_augment *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  for (notif = (lysp_node_notif *)modp->rpcs; notif != (lysp_node_notif *)0x0;
      notif = (notif->field_0).field_1.next) {
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_action(pctx,(lysp_node_action *)notif);
  }
  if (modp->rpcs != (lysp_node_action *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  for (grp = (lysp_node_grp *)modp->notifs; grp != (lysp_node_grp *)0x0;
      grp = (grp->field_0).field_1.next) {
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_notification(pctx,(lysp_node_notif *)grp);
  }
  if (modp->notifs != (lysp_node_notif *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  data = (lysp_node *)0x0;
  while( true ) {
    if (modp->deviations == (lysp_deviation *)0x0) {
      local_98 = (lysp_ext_instance *)0x0;
    }
    else {
      local_98 = modp->deviations[-1].exts;
    }
    if (local_98 <= data) break;
    if ((((pctx->field_0).field_0.flags & 1) != 0) &&
       ((pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags & 0xfffe,
       ((pctx->field_0).field_0.options & 2) == 0)) {
      ly_print_((pctx->field_0).field_0.out,"\n");
    }
    yprp_deviation(pctx,modp->deviations + (long)data);
    data = (lysp_node *)((long)&data->parent + 1);
  }
  if (modp->deviations != (lysp_deviation *)0x0) {
    (pctx->field_0).field_0.flags = (pctx->field_0).field_0.flags | 1;
  }
  return;
}

Assistant:

static void
yang_print_parsed_body(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_node *data;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;
    struct lysp_node_grp *grp;
    struct lysp_node_augment *aug;

    LY_ARRAY_FOR(modp->extensions, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension(pctx, &modp->extensions[u]);
    }

    YPR_EXTRA_LINE(modp->extensions, pctx);

    if (yprp_extension_has_printable_instances(modp->exts)) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_extension_instances(pctx, LY_STMT_MODULE, 0, modp->exts, NULL);
    }

    YPR_EXTRA_LINE(modp->exts, pctx);

    LY_ARRAY_FOR(modp->features, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_feature(pctx, &modp->features[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->features, pctx);

    LY_ARRAY_FOR(modp->identities, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_identity(pctx, &modp->identities[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->identities, pctx);

    LY_ARRAY_FOR(modp->typedefs, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_typedef(pctx, &modp->typedefs[u]);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->typedefs, pctx);

    LY_LIST_FOR(modp->groupings, grp) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_grouping(pctx, grp);
        YPR_EXTRA_LINE(1, pctx);
    }

    YPR_EXTRA_LINE(modp->groupings, pctx);

    LY_LIST_FOR(modp->data, data) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_node(pctx, data);
    }

    YPR_EXTRA_LINE(modp->data, pctx);

    LY_LIST_FOR(modp->augments, aug) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_augment(pctx, aug);
    }

    YPR_EXTRA_LINE(modp->augments, pctx);

    LY_LIST_FOR(modp->rpcs, action) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_action(pctx, action);
    }

    YPR_EXTRA_LINE(modp->rpcs, pctx);

    LY_LIST_FOR(modp->notifs, notif) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_notification(pctx, notif);
    }

    YPR_EXTRA_LINE(modp->notifs, pctx);

    LY_ARRAY_FOR(modp->deviations, u) {
        YPR_EXTRA_LINE_PRINT(pctx);
        yprp_deviation(pctx, &modp->deviations[u]);
    }

    YPR_EXTRA_LINE(modp->deviations, pctx);
}